

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignVarCommand.cpp
# Opt level: O3

double __thiscall AssignVarCommand::execute(AssignVarCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pbVar3;
  MathInterpreter *this_00;
  pointer pcVar4;
  Variable *this_01;
  DataBase *this_02;
  int iVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *this_03;
  iterator iVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar7;
  mapped_type *ppVVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  undefined8 uVar14;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  string var_name;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  var_name._M_dataplus._M_p = (pointer)0x0;
  var_name._M_string_length._0_1_ = 0;
  pbVar3 = (this->param_v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = this->i;
  pcVar4 = (pbVar3->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_f0 = (undefined1  [8])&var_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar4,pcVar4 + pbVar3->_M_string_length);
  MathInterpreter::insertVariables(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::find
            ((char *)(this->param_v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0x110ac3,0);
  std::__cxx11::string::substr
            ((ulong)&local_50,
             (ulong)(this->param_v).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)local_f0,(string *)&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_03 = &DataBase::getInVarMap_abi_cxx11_(d)->_M_t;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::find(this_03,(key_type *)local_f0);
  pmVar7 = DataBase::getInVarMap_abi_cxx11_(d);
  if ((_Rb_tree_header *)iVar6._M_node == &(pmVar7->_M_t)._M_impl.super__Rb_tree_header)
  goto LAB_0010ad1b;
  pmVar7 = DataBase::getInVarMap_abi_cxx11_(d);
  ppVVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            ::at(pmVar7,(key_type *)local_f0);
  this_01 = *ppVVar8;
  Variable::getBindSimbol_abi_cxx11_(&local_50,this_01);
  iVar5 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_02 = d;
  if (iVar5 != 0) goto LAB_0010ad1b;
  Variable::getSim_abi_cxx11_(&local_130,this_01);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x110314);
  local_b0 = &local_a0;
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_a0 = *plVar11;
    lStack_98 = plVar9[3];
  }
  else {
    local_a0 = *plVar11;
    local_b0 = (long *)*plVar9;
  }
  local_a8 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_60 = *puVar12;
    uStack_58 = (undefined4)plVar9[3];
    uStack_54 = *(undefined4 *)((long)plVar9 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar12;
    local_70 = (ulong *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (**(this_01->super_Expression)._vptr_Expression)(this_01);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_90,vsnprintf,0x148,"%f");
  uVar13 = 0xf;
  if (local_70 != &local_60) {
    uVar13 = local_60;
  }
  if (uVar13 < local_90._M_string_length + local_68) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar14 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_90._M_string_length + local_68) goto LAB_0010abb6;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0010abb6:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
  }
  psVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50.field_2._8_8_ = puVar10[3];
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar2;
    local_50._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_50._M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_c0 = *plVar11;
    lStack_b8 = plVar9[3];
    var_name.field_2._8_8_ = &stack0xffffffffffffff40;
  }
  else {
    local_c0 = *plVar11;
    var_name.field_2._8_8_ = (long *)*plVar9;
  }
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  DataBase::addToUpdateSimQueue(this_02,(string *)((long)&var_name.field_2 + 8));
  if ((long *)var_name.field_2._8_8_ != &stack0xffffffffffffff40) {
    operator_delete((void *)var_name.field_2._8_8_,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
LAB_0010ad1b:
  if (local_f0 != (undefined1  [8])&var_name._M_string_length) {
    operator_delete((void *)local_f0,
                    CONCAT71(var_name._M_string_length._1_7_,(undefined1)var_name._M_string_length)
                    + 1);
  }
  return 0.0;
}

Assistant:

double AssignVarCommand::execute() {
  string var_name;
  int p;
  //assing in data
  this->i->insertVariables((this->param_v)[0]);
  //assign in simulator
  p = this->param_v[0].find("=");
  var_name = param_v[0].substr(0, p);
  if (!(d->getInVarMap()->find(var_name) == d->getInVarMap()->end())) {
    Variable *temp = d->getInVarMap()->at(var_name);
    // send instruction to simulator
    if (temp->getBindSimbol() == "->") {
      d->addToUpdateSimQueue(
          "set " + temp->getSim() + " " + to_string(temp->calculate())
              + "\r\n");
    }
  }
  return 0;
}